

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execAndisr<(moira::Instr)62,(moira::Mode)11,(moira::Size)2>(Moira *this,u16 opcode)

{
  u16 uVar1;
  u32 uVar2;
  
  if ((this->reg).sr.s != false) {
    uVar2 = readI<(moira::Size)2>(this);
    uVar1 = getSR(this);
    (*this->_vptr_Moira[0x19])(this,8);
    uVar2 = logic<(moira::Instr)62,(moira::Size)2>(this,uVar2,(uint)uVar1);
    setSR(this,(u16)uVar2);
    readM<(moira::MemSpace)1,(moira::Size)2,0ul>(this,(this->reg).pc + 2);
    prefetch<4ul>(this);
    return;
  }
  execPrivilegeException(this);
  return;
}

Assistant:

void
Moira::execAndisr(u16 opcode)
{
    SUPERVISOR_MODE_ONLY

    u32 src = readI<S>();
    u16 dst = getSR();

    sync(8);

    u32 result = logic<I,S>(src, dst);
    setSR(result);

    (void)readM<MEM_DATA, Word>(reg.pc+2);
    prefetch<POLLIPL>();
}